

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

bool __thiscall ASigil::HandlePickup(ASigil *this,AInventory *item)

{
  int iVar1;
  AInventory *pAVar2;
  PClass *pPVar3;
  undefined1 uVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  bool bVar7;
  
  pPVar3 = RegistrationInfo.MyClass;
  if ((item->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar5 = (**(item->super_AActor).super_DThinker.super_DObject._vptr_DObject)(item);
    (item->super_AActor).super_DThinker.super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5)
    ;
  }
  pPVar6 = (item->super_AActor).super_DThinker.super_DObject.Class;
  bVar7 = pPVar6 != (PClass *)0x0;
  if (pPVar6 != pPVar3 && bVar7) {
    do {
      pPVar6 = pPVar6->ParentClass;
      bVar7 = pPVar6 != (PClass *)0x0;
      if (pPVar6 == pPVar3) break;
    } while (pPVar6 != (PClass *)0x0);
  }
  if (bVar7) {
    iVar5 = *(int *)((long)&item[1].super_AActor.Angles.CamRoll.Degrees + 4);
    iVar1 = *(int *)&(this->super_AWeapon).field_0x584;
    bVar7 = true;
    if (iVar1 < iVar5) {
      *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
      (this->super_AWeapon).super_AInventory.Icon.texnum = (item->Icon).texnum;
      if ((((this->super_AWeapon).super_AInventory.Owner.field_0.p)->player != (player_t *)0x0) &&
         ((ASigil *)((this->super_AWeapon).super_AInventory.Owner.field_0.p)->player->ReadyWeapon ==
          this)) {
        this->DownPieces = iVar1;
        ((this->super_AWeapon).super_AInventory.Owner.field_0.p)->player->PendingWeapon =
             &this->super_AWeapon;
      }
      *(int *)&(this->super_AWeapon).field_0x584 = iVar5;
    }
  }
  else {
    pAVar2 = (this->super_AWeapon).super_AInventory.super_AActor.Inventory.field_0.p;
    if (pAVar2 != (AInventory *)0x0) {
      if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar2 = (this->super_AWeapon).super_AInventory.super_AActor.Inventory.field_0.p;
        uVar4 = (*(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37])
                          (pAVar2,item);
        return (bool)uVar4;
      }
      (this->super_AWeapon).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ASigil::HandlePickup (AInventory *item)
{
	if (item->IsKindOf (RUNTIME_CLASS(ASigil)))
	{
		int otherPieces = static_cast<ASigil*>(item)->NumPieces;
		if (otherPieces > NumPieces)
		{
			item->ItemFlags |= IF_PICKUPGOOD;
			Icon = item->Icon;
			// If the player is holding the Sigil right now, drop it and bring
			// it back with the new piece(s) in view.
			if (Owner->player != NULL && Owner->player->ReadyWeapon == this)
			{
				DownPieces = NumPieces;
				Owner->player->PendingWeapon = this;
			}
			NumPieces = otherPieces;
		}
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}